

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O3

int __thiscall cmValue::Compare(cmValue *this,string_view value)

{
  string *psVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char *__s2;
  difference_type __diff;
  ulong uVar5;
  
  __s2 = value._M_str;
  uVar5 = value._M_len;
  psVar1 = this->Value;
  if (psVar1 == (string *)0x0) {
    return -(uint)(__s2 != (char *)0x0);
  }
  if (__s2 == (char *)0x0) {
    return 1;
  }
  uVar2 = psVar1->_M_string_length;
  uVar4 = uVar5;
  if (uVar2 < uVar5) {
    uVar4 = uVar2;
  }
  if (uVar4 != 0) {
    uVar3 = memcmp((psVar1->_M_dataplus)._M_p,__s2,uVar4);
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0) goto LAB_001254a8;
  }
  uVar4 = 0xffffffff80000000;
  if (-0x80000000 < (long)(uVar2 - uVar5)) {
    uVar4 = uVar2 - uVar5;
  }
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0x7fffffff;
  }
LAB_001254a8:
  return (int)uVar4;
}

Assistant:

int cmValue::Compare(cm::string_view value) const noexcept
{
  if (this->Value == nullptr && value.data() == nullptr) {
    return 0;
  }
  if (this->Value == nullptr) {
    return -1;
  }
  if (value.data() == nullptr) {
    return 1;
  }
  return cm::string_view(*this->Value).compare(value);
}